

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

void Gia_ManSimDelete(Gia_ManSim_t *p)

{
  Gia_ManSim_t *p_local;
  
  Vec_IntFreeP(&p->vConsts);
  Vec_IntFreeP(&p->vCis2Ids);
  Gia_ManStopP(&p->pAig);
  if (p->pDataSim != (uint *)0x0) {
    free(p->pDataSim);
    p->pDataSim = (uint *)0x0;
  }
  if (p->pDataSimCis != (uint *)0x0) {
    free(p->pDataSimCis);
    p->pDataSimCis = (uint *)0x0;
  }
  if (p->pDataSimCos != (uint *)0x0) {
    free(p->pDataSimCos);
    p->pDataSimCos = (uint *)0x0;
  }
  if (p != (Gia_ManSim_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Gia_ManSimDelete( Gia_ManSim_t * p )
{
    Vec_IntFreeP( &p->vConsts );
    Vec_IntFreeP( &p->vCis2Ids );
    Gia_ManStopP( &p->pAig );
    ABC_FREE( p->pDataSim );
    ABC_FREE( p->pDataSimCis );
    ABC_FREE( p->pDataSimCos );
    ABC_FREE( p );
}